

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O1

bool verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
               (TSTNode<unsigned_int> *node,size_t depth)

{
  byte bVar1;
  char cVar2;
  TSTNode<unsigned_int> *pTVar3;
  long lVar4;
  bool bVar5;
  void *in_RAX;
  long lVar6;
  long lVar7;
  uint uVar8;
  TSTNode<unsigned_int> *pTVar9;
  
  do {
    pTVar9 = node;
    pTVar3 = (TSTNode<unsigned_int> *)(pTVar9->buckets)._M_elems[0];
    if (((pTVar9->is_tst).super__Base_bitset<1UL>._M_w & 1) == 0) {
      if (pTVar3 != (TSTNode<unsigned_int> *)0x0) {
        in_RAX = (pTVar3->buckets)._M_elems[0];
        lVar6 = (long)(pTVar3->buckets)._M_elems[1] - (long)in_RAX;
        if (lVar6 != 0) {
          lVar6 = lVar6 >> 3;
          lVar7 = 0;
          do {
            lVar4 = *(long *)((long)in_RAX + lVar7 * 8);
            if (lVar4 == 0) goto LAB_001a5906;
            if (*(byte *)(lVar4 + depth) == 0) {
              uVar8 = 0;
            }
            else {
              uVar8 = (uint)*(byte *)(lVar4 + depth) << 0x18;
              bVar1 = *(byte *)(lVar4 + 1 + depth);
              if (bVar1 != 0) {
                uVar8 = uVar8 | (uint)bVar1 << 0x10;
                cVar2 = *(char *)(lVar4 + 2 + depth);
                if (cVar2 != '\0') {
                  uVar8 = uVar8 | CONCAT11(cVar2,*(undefined1 *)(lVar4 + 3 + depth));
                }
              }
            }
            if (pTVar9->pivot <= uVar8) {
              __assert_fail("ch < node->pivot",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                            ,0xb7,
                            "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 0U, BucketT = std::vector<unsigned char *>, CharT = unsigned int]"
                           );
            }
            lVar7 = lVar7 + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
        }
      }
    }
    else {
      bVar5 = verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
                        (pTVar3,depth);
      in_RAX = (void *)(ulong)bVar5;
    }
    pTVar3 = (TSTNode<unsigned_int> *)(pTVar9->buckets)._M_elems[1];
    if (((pTVar9->is_tst).super__Base_bitset<1UL>._M_w & 2) == 0) {
      if (pTVar3 != (TSTNode<unsigned_int> *)0x0) {
        in_RAX = (pTVar3->buckets)._M_elems[0];
        lVar6 = (long)(pTVar3->buckets)._M_elems[1] - (long)in_RAX;
        if (lVar6 != 0) {
          lVar6 = lVar6 >> 3;
          lVar7 = 0;
          do {
            lVar4 = *(long *)((long)in_RAX + lVar7 * 8);
            if (lVar4 == 0) goto LAB_001a5906;
            if (*(byte *)(lVar4 + depth) == 0) {
              uVar8 = 0;
            }
            else {
              uVar8 = (uint)*(byte *)(lVar4 + depth) << 0x18;
              bVar1 = *(byte *)(lVar4 + 1 + depth);
              if (bVar1 != 0) {
                uVar8 = uVar8 | (uint)bVar1 << 0x10;
                cVar2 = *(char *)(lVar4 + 2 + depth);
                if (cVar2 != '\0') {
                  uVar8 = uVar8 | CONCAT11(cVar2,*(undefined1 *)(lVar4 + 3 + depth));
                }
              }
            }
            if (uVar8 != pTVar9->pivot) {
              __assert_fail("ch == node->pivot",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                            ,0xbd,
                            "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 1U, BucketT = std::vector<unsigned char *>, CharT = unsigned int]"
                           );
            }
            lVar7 = lVar7 + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
        }
      }
    }
    else {
      bVar5 = verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
                        (pTVar3,depth + 4);
      in_RAX = (void *)(ulong)bVar5;
    }
    node = (TSTNode<unsigned_int> *)(pTVar9->buckets)._M_elems[2];
  } while (((pTVar9->is_tst).super__Base_bitset<1UL>._M_w & 4) != 0);
  if (node != (TSTNode<unsigned_int> *)0x0) {
    in_RAX = (node->buckets)._M_elems[0];
    lVar6 = (long)(node->buckets)._M_elems[1] - (long)in_RAX;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 3;
      lVar7 = 0;
      do {
        lVar4 = *(long *)((long)in_RAX + lVar7 * 8);
        if (lVar4 == 0) {
LAB_001a5906:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x38,"uint32_t get_char(unsigned char *, size_t)");
        }
        if (*(byte *)(lVar4 + depth) == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (uint)*(byte *)(lVar4 + depth) << 0x18;
          bVar1 = *(byte *)(lVar4 + 1 + depth);
          if (bVar1 != 0) {
            uVar8 = uVar8 | (uint)bVar1 << 0x10;
            cVar2 = *(char *)(lVar4 + 2 + depth);
            if (cVar2 != '\0') {
              uVar8 = uVar8 | CONCAT11(cVar2,*(undefined1 *)(lVar4 + 3 + depth));
            }
          }
        }
        if (uVar8 <= pTVar9->pivot) {
          __assert_fail("ch > node->pivot",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                        ,0xc3,
                        "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 2U, BucketT = std::vector<unsigned char *>, CharT = unsigned int]"
                       );
        }
        lVar7 = lVar7 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
    }
  }
  return SUB81(in_RAX,0);
}

Assistant:

static bool
verify_tst(TSTNode<CharT>* node, size_t depth)
{
	if (node->pivot)
		debug() << __func__ << "() pivot=" << node->pivot << " depth=" << depth << '\n';
	else
		debug() << __func__ << "() pivot=" << int(node->pivot) << " depth=" << depth << '\n';
	debug_indent;
	verify_bucket<0, BucketT, CharT>(node, depth);
	verify_bucket<1, BucketT, CharT>(node, depth);
	verify_bucket<2, BucketT, CharT>(node, depth);
	return true;
}